

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
::
find<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::Array<unsigned_char>&>
          (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                 table,Array<unsigned_char> *params)

{
  ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
  table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Entry *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  Entry *this_00;
  Array<unsigned_char> *in_R8;
  Maybe<unsigned_long> MVar5;
  ulong local_68;
  HashIndex<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Callbacks>
  *local_60;
  Entry *local_58;
  HashBucket *local_48;
  HashBucket *bucket;
  uint local_38;
  uint i;
  uint hashCode;
  Array<unsigned_char> *params_local;
  HashIndex<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Callbacks>
  *this_local;
  ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
  table_local;
  
  this_local = (HashIndex<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>::Callbacks>
                *)table.size_;
  this_00 = table.ptr;
  _hashCode = in_R8;
  params_local = (Array<unsigned_char> *)this_00;
  table_local.ptr = (Entry *)params;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)&this_00->value);
  if (sVar3 == 0) {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
    aVar4 = extraout_RDX;
  }
  else {
    uVar2 = HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
            ::Callbacks::hashCode<kj::Array<unsigned_char>&>((Callbacks *)this_00,_hashCode);
    local_38 = uVar2;
    sVar3 = Array<kj::_::HashBucket>::size((Array<kj::_::HashBucket> *)&this_00->value);
    bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
    while( true ) {
      local_48 = Array<kj::_::HashBucket>::operator[]
                           ((Array<kj::_::HashBucket> *)&this_00->value,(ulong)bucket._4_4_);
      bVar1 = kj::_::HashBucket::isEmpty(local_48);
      if (bVar1) break;
      bVar1 = kj::_::HashBucket::isErased(local_48);
      if ((!bVar1) && (local_48->hash == local_38)) {
        local_60 = this_local;
        local_58 = table_local.ptr;
        table_00.size_ = (size_t)table_local.ptr;
        table_00.ptr = (Entry *)this_local;
        e = kj::_::HashBucket::
            getRow<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                      (local_48,table_00);
        bVar1 = HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>
                ::Callbacks::matches<kj::Array<unsigned_char>&>((Callbacks *)this_00,e,_hashCode);
        if (bVar1) {
          uVar2 = kj::_::HashBucket::getPos(local_48);
          local_68 = (ulong)uVar2;
          Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_68);
          aVar4 = extraout_RDX_01;
          goto LAB_005468e3;
        }
      }
      sVar3 = kj::_::probeHash((Array<kj::_::HashBucket> *)&this_00->value,(ulong)bucket._4_4_);
      bucket._4_4_ = (uint)sVar3;
    }
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
    aVar4 = extraout_RDX_00;
  }
LAB_005468e3:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }